

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O0

bool __thiscall GrcManager::StorePseudoToActualAsGlyphAttr(GrcManager *this)

{
  int iVar1;
  Symbol this_00;
  long in_RDI;
  int nAttrID;
  Symbol psym;
  vector<GdlExpression_*,_std::allocator<GdlExpression_*>_> *vpexpExtra;
  allocator *paVar2;
  int nAttrID_00;
  undefined4 in_stack_ffffffffffffffbc;
  GdlRenderer *in_stack_ffffffffffffffc0;
  allocator local_31;
  string local_30 [8];
  string *in_stack_ffffffffffffffd8;
  GrcSymbolTable *in_stack_ffffffffffffffe0;
  
  vpexpExtra = *(vector<GdlExpression_*,_std::allocator<GdlExpression_*>_> **)(in_RDI + 0x90);
  paVar2 = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"*actualForPseudo*",paVar2);
  nAttrID_00 = (int)((ulong)paVar2 >> 0x20);
  this_00 = GrcSymbolTable::FindSymbol(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  iVar1 = GrcSymbolTableEntry::InternalID(this_00);
  GdlRenderer::StorePseudoToActualAsGlyphAttr
            (in_stack_ffffffffffffffc0,
             (GrcGlyphAttrMatrix *)CONCAT44(in_stack_ffffffffffffffbc,iVar1),nAttrID_00,vpexpExtra);
  return true;
}

Assistant:

bool GrcManager::StorePseudoToActualAsGlyphAttr()
{
	Symbol psym = m_psymtbl->FindSymbol("*actualForPseudo*");
	Assert(psym);
	int nAttrID = psym->InternalID();

	m_prndr->StorePseudoToActualAsGlyphAttr(m_pgax, nAttrID, m_vpexpModified);

	return true;
}